

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::SListLeaf::SListLeaf
          (SListLeaf *this,TermList ts)

{
  Node *pNVar1;
  long lVar2;
  
  (this->super_Leaf).super_Node._term._content = ts._content;
  (this->super_Leaf).super_Node._vptr_Node = (_func_int **)&PTR__SListLeaf_00b5baf0;
  pNVar1 = (Node *)::operator_new(0x150,0x10);
  (this->_children)._left = pNVar1;
  (this->_children)._top = 0;
  lVar2 = 0x28;
  do {
    ((this->_children)._left)->nodes[lVar2 + -9] = (Node *)0x0;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 8);
  return;
}

Assistant:

SListLeaf(TermList ts) : Leaf(ts) {}